

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
* __thiscall
cmCTest::Private::GetNamedTestingHandlers_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
           *__return_storage_ptr__,Private *this)

{
  long lVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>
  __l;
  allocator_type local_202;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_201;
  cmCTestUploadHandler *local_200;
  cmCTestSubmitHandler *local_1f8;
  cmCTestMemCheckHandler *local_1f0;
  cmCTestConfigureHandler *local_1e8;
  cmCTestUpdateHandler *local_1e0;
  cmCTestTestHandler *local_1d8;
  cmCTestScriptHandler *local_1d0;
  cmCTestCoverageHandler *local_1c8;
  cmCTestBuildAndTestHandler *local_1c0;
  cmCTestBuildHandler *local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  local_48;
  
  local_1b8 = &this->BuildHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[6],_cmCTestBuildHandler_*,_true>
            (&local_1b0,(char (*) [6])0x5fe99e,&local_1b8);
  local_1c0 = &this->BuildAndTestHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[10],_cmCTestBuildAndTestHandler_*,_true>
            (&local_188,(char (*) [10])"buildtest",&local_1c0);
  local_1c8 = &this->CoverageHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[9],_cmCTestCoverageHandler_*,_true>
            (&local_160,(char (*) [9])0x5fe9b1,&local_1c8);
  local_1d0 = &this->ScriptHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestScriptHandler_*,_true>
            (&local_138,(char (*) [7])0x5fe73d,&local_1d0);
  local_1d8 = &this->TestHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[5],_cmCTestTestHandler_*,_true>
            (&local_110,(char (*) [5])0x5fe9a8,&local_1d8);
  local_1e0 = &this->UpdateHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestUpdateHandler_*,_true>
            (&local_e8,(char (*) [7])0x5fe985,&local_1e0);
  local_1e8 = &this->ConfigureHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[10],_cmCTestConfigureHandler_*,_true>
            (&local_c0,(char (*) [10])0x5fe990,&local_1e8);
  local_1f0 = &this->MemCheckHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[9],_cmCTestMemCheckHandler_*,_true>
            (&local_98,(char (*) [9])0x5fe9be,&local_1f0);
  local_1f8 = &this->SubmitHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestSubmitHandler_*,_true>
            (&local_70,(char (*) [7])0x5fe9d5,&local_1f8);
  local_200 = &this->UploadHandler;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>
  ::pair<const_char_(&)[7],_cmCTestUploadHandler_*,_true>
            (&local_48,(char (*) [7])0x604d4b,&local_200);
  __l._M_len = 10;
  __l._M_array = &local_1b0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::map(__return_storage_ptr__,__l,&local_201,&local_202);
  lVar1 = 0x168;
  do {
    std::__cxx11::string::~string((string *)((long)&local_1b0.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cmCTestGenericHandler*> GetNamedTestingHandlers()
  {
    return { { "build", &this->BuildHandler },
             { "buildtest", &this->BuildAndTestHandler },
             { "coverage", &this->CoverageHandler },
             { "script", &this->ScriptHandler },
             { "test", &this->TestHandler },
             { "update", &this->UpdateHandler },
             { "configure", &this->ConfigureHandler },
             { "memcheck", &this->MemCheckHandler },
             { "submit", &this->SubmitHandler },
             { "upload", &this->UploadHandler } };
  }